

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
                 *this,GetterXsYs<unsigned_char> *getter1,GetterXsYRef<unsigned_char> *getter2,
                TransformerLinLog *transformer,ImU32 col)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  GetterXsYRef<unsigned_char> *pGVar5;
  TransformerLinLog *pTVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  int iVar9;
  long lVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar3 = getter1->Count;
  iVar9 = getter2->Count;
  if (iVar3 < getter2->Count) {
    iVar9 = iVar3;
  }
  this->Prims = iVar9 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar8 = GImPlot;
  (this->P12).y = 0.0;
  lVar10 = (long)((getter1->Offset % iVar3 + iVar3) % iVar3) * (long)getter1->Stride;
  bVar2 = getter1->Xs[lVar10];
  dVar7 = log10((double)getter1->Ys[lVar10] /
                GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar3 = transformer->YAxis;
  pIVar4 = pIVar8->CurrentPlot;
  dVar1 = pIVar4->YAxis[iVar3].Range.Min;
  IVar11.x = (float)(((double)bVar2 - (pIVar4->XAxis).Range.Min) * pIVar8->Mx +
                    (double)pIVar8->PixelRange[iVar3].Min.x);
  IVar11.y = (float)((((double)(float)(dVar7 / pIVar8->LogDenY[iVar3]) *
                       (pIVar4->YAxis[iVar3].Range.Max - dVar1) + dVar1) - dVar1) *
                     pIVar8->My[iVar3] + (double)pIVar8->PixelRange[iVar3].Min.y);
  this->P11 = IVar11;
  pIVar8 = GImPlot;
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  iVar3 = pGVar5->Count;
  bVar2 = pGVar5->Xs[(long)((pGVar5->Offset % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride];
  dVar7 = log10(pGVar5->YRef / GImPlot->CurrentPlot->YAxis[pTVar6->YAxis].Range.Min);
  iVar3 = pTVar6->YAxis;
  pIVar4 = pIVar8->CurrentPlot;
  dVar1 = pIVar4->YAxis[iVar3].Range.Min;
  IVar12.x = (float)(((double)bVar2 - (pIVar4->XAxis).Range.Min) * pIVar8->Mx +
                    (double)pIVar8->PixelRange[iVar3].Min.x);
  IVar12.y = (float)((((double)(float)(dVar7 / pIVar8->LogDenY[iVar3]) *
                       (pIVar4->YAxis[iVar3].Range.Max - dVar1) + dVar1) - dVar1) *
                     pIVar8->My[iVar3] + (double)pIVar8->PixelRange[iVar3].Min.y);
  this->P12 = IVar12;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }